

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::setCallback(Highs *this,HighsCCallbackType c_callback,void *user_callback_data)

{
  _func_void__Any_data_ptr_int_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_HighsCallbackDataOut_ptr_ptr_HighsCallbackDataIn_ptr_ptr_void_ptr_ptr
  *__tmp_2;
  _Any_data __tmp;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  HighsCCallbackType local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  HighsCallback::clear(&this->callback_);
  uStack_30 = 0;
  uStack_2c = 0;
  local_58._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(this->callback_).user_callback.super__Function_base._M_functor;
  local_58._8_8_ =
       *(undefined8 *)((long)&(this->callback_).user_callback.super__Function_base._M_functor + 8);
  *(HighsCCallbackType *)&(this->callback_).user_callback.super__Function_base._M_functor =
       c_callback;
  *(undefined4 *)((long)&(this->callback_).user_callback.super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&(this->callback_).user_callback.super__Function_base._M_functor + 0xc) = 0;
  local_48 = (this->callback_).user_callback.super__Function_base._M_manager;
  (this->callback_).user_callback.super__Function_base._M_manager =
       std::
       _Function_handler<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:2230:7)>
       ::_M_manager;
  p_Stack_40 = (this->callback_).user_callback._M_invoker;
  (this->callback_).user_callback._M_invoker =
       std::
       _Function_handler<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:2230:7)>
       ::_M_invoke;
  if (local_48 != (_Manager_type)0x0) {
    local_38 = c_callback;
    (*local_48)(&local_58,&local_58,__destroy_functor);
    c_callback = local_38;
  }
  (this->callback_).user_callback_data = user_callback_data;
  local_38 = c_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(&(this->options_).super_HighsOptionsStruct.log_options.user_callback,
              &(this->callback_).user_callback);
  (this->options_).super_HighsOptionsStruct.log_options.user_callback_data =
       (this->callback_).user_callback_data;
  (this->options_).super_HighsOptionsStruct.log_options.user_callback_active = false;
  return kOk;
}

Assistant:

HighsStatus Highs::setCallback(HighsCCallbackType c_callback,
                               void* user_callback_data) {
  this->callback_.clear();
  this->callback_.user_callback =
      [c_callback](int a, const std::string& b, const HighsCallbackDataOut* c,
                   HighsCallbackDataIn* d,
                   void* e) { c_callback(a, b.c_str(), c, d, e); };
  this->callback_.user_callback_data = user_callback_data;

  options_.log_options.user_callback = this->callback_.user_callback;
  options_.log_options.user_callback_data = this->callback_.user_callback_data;
  options_.log_options.user_callback_active = false;
  return HighsStatus::kOk;
}